

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O1

bool spvtools::opt::(anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>
               (Instruction *instruction,_func_bool_Instruction_ptr *predicate)

{
  Op op;
  IRContext *this;
  DefUseManager *this_00;
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int32_t iVar6;
  _Elt_pointer puVar7;
  Instruction *instruction_00;
  ulong uVar8;
  uint **ppuVar9;
  uint32_t uVar10;
  uint uVar11;
  bool bVar12;
  pointer pOVar13;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  uint *local_90;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  
  op = instruction->opcode_;
  iVar6 = spvOpcodeGeneratesType(op);
  if ((op != OpTypeForwardPointer) && (iVar6 == 0)) {
    __assert_fail("IsTypeInst(instruction->opcode()) && \"AnyTypeOf called with a non-type instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0x69,
                  "bool spvtools::opt::(anonymous namespace)::AnyTypeOf(const Instruction *, UnaryPredicate) [UnaryPredicate = bool (*)(const spvtools::opt::Instruction *)]"
                 );
  }
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  uVar10 = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_88,0);
  if (instruction->has_result_id_ == true) {
    uVar10 = Instruction::GetSingleWordOperand(instruction,(uint)instruction->has_type_id_);
  }
  local_d8 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
             CONCAT44(local_d8._4_4_,uVar10);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,(uint *)&local_d8);
  this = instruction->context_;
  if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar12 = false;
  }
  else {
    this_00 = (this->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    bVar12 = false;
    do {
      puVar7 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar7 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      instruction_00 = analysis::DefUseManager::GetDef(this_00,puVar7[-1]);
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      bVar3 = true;
      if (((!bVar12) && (bVar4 = anon_unknown_0::is16bitType(instruction_00), !bVar4)) &&
         (uVar8 = (ulong)instruction_00->opcode_, bVar3 = bVar12, uVar8 < 0x21)) {
        if ((0x31800000UL >> (uVar8 & 0x3f) & 1) == 0) {
          if (uVar8 == 0x1e) {
            uStack_b0 = 0;
            local_b8 = &local_88;
            pcStack_a0 = std::
                         _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                         ::_M_invoke;
            local_a8 = std::
                       _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                       ::_M_manager;
            uStack_d0 = 0;
            local_d8 = &local_b8;
            pcStack_c0 = std::
                         _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
                         ::_M_invoke;
            local_c8 = std::
                       _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
                       ::_M_manager;
            pOVar1 = (instruction_00->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pOVar13 = (instruction_00->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start; pOVar13 != pOVar1;
                pOVar13 = pOVar13 + 1) {
              if ((pOVar13->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
                ppuVar2 = (uint **)(pOVar13->words).large_data_._M_t.
                                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl;
                ppuVar9 = &(pOVar13->words).small_data_;
                if (ppuVar2 != (uint **)0x0) {
                  ppuVar9 = ppuVar2;
                }
                local_90 = *ppuVar9;
                if (local_c8 == (code *)0x0) {
                  std::__throw_bad_function_call();
                }
                cVar5 = (*pcStack_c0)(&local_d8,&local_90);
                if (cVar5 == '\0') break;
              }
            }
            if (local_c8 != (code *)0x0) {
              (*local_c8)(&local_d8,&local_d8,3);
            }
            if (local_a8 != (code *)0x0) {
              (*local_a8)(&local_b8,&local_b8,3);
            }
          }
          else if (uVar8 == 0x20) {
            uVar11 = (instruction_00->has_result_id_ & 1) + 1;
            if (instruction_00->has_type_id_ == false) {
              uVar11 = (uint)instruction_00->has_result_id_;
            }
            uVar10 = uVar11 + 1;
            goto LAB_005480ce;
          }
        }
        else {
          uVar10 = (instruction_00->has_result_id_ & 1) + 1;
          if (instruction_00->has_type_id_ == false) {
            uVar10 = (uint)instruction_00->has_result_id_;
          }
LAB_005480ce:
          uVar10 = Instruction::GetSingleWordOperand(instruction_00,uVar10);
          local_d8 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
                     CONCAT44(local_d8._4_4_,uVar10);
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
                     (uint *)&local_d8);
        }
      }
      bVar12 = bVar3;
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
  return bVar12;
}

Assistant:

static bool AnyTypeOf(const Instruction* instruction,
                      UnaryPredicate predicate) {
  assert(IsTypeInst(instruction->opcode()) &&
         "AnyTypeOf called with a non-type instruction.");

  bool found_one = false;
  DFSWhile(instruction, [&found_one, predicate](const Instruction* node) {
    if (found_one || predicate(node)) {
      found_one = true;
      return false;
    }

    return true;
  });
  return found_one;
}